

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O3

int optimizeBlock(void)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  
  if (*p == '[') {
    p = p + 1;
    skipSpaces();
    pcVar2 = p;
    if (*p == ']') {
      lVar4 = (long)byteTop;
      byteTop = byteTop + 1;
      byteBuffer[lVar4] = 'P';
      if (0x7fe < lVar4) {
        error_impl("genByte",0x354,"too many bytecodes");
        pcVar2 = p;
      }
LAB_00106857:
      p = pcVar2 + 1;
      skipSpaces();
      return 1;
    }
    iVar1 = parseStatement();
    while (iVar1 != 0) {
      cVar3 = *p;
      if (cVar3 == '.') {
        p = p + 1;
        skipSpaces();
        cVar3 = *p;
      }
      pcVar2 = p;
      if (cVar3 == ']') goto LAB_00106857;
      lVar4 = (long)byteTop;
      byteTop = byteTop + 1;
      byteBuffer[lVar4] = 0xf5;
      if (0x7fe < lVar4) {
        error_impl("genByte",0x354,"too many bytecodes");
      }
      iVar1 = parseStatement();
    }
  }
  else {
    iVar1 = parseTerm();
    if (iVar1 != 0) {
      parseError("missing block as optimized block argument");
    }
  }
  return 0;
}

Assistant:

int optimizeBlock(void)
{
    if (*p != '[') {
        if (!parseTerm())
            return 0;
        parseError("missing block as optimized block argument");
    } else {
        p++;
        skipSpaces();
        if (*p == ']') {
            genInstruction(PushConstant, 0);
            p++;
            skipSpaces();
            return 1;
        }
        while (1) {
            if (!parseStatement())
                return 0;
            if (*p == '.')
                p++, skipSpaces();
            if (*p == ']')
                break;
            genInstruction(DoSpecial, PopTop);
        }
        p++;
        skipSpaces();
        /* just leave last expression on stack */
    }
    return 1;
}